

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_finishset(lua_State *L,Table *t,TValue *key,TValue *value,int hres)

{
  Node *pNVar1;
  int iVar2;
  TValue *io2;
  TValue *io1;
  TValue *io;
  lua_Integer k;
  lua_Number f;
  TValue aux;
  int hres_local;
  TValue *value_local;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  if (hres == 1) {
    aux._12_4_ = hres;
    if ((key->tt_ & 0xf) == 0) {
      luaG_runerror(L,"table index is nil");
    }
    value_local = key;
    if (key->tt_ == '\x13') {
      k = (key->value_).i;
      iVar2 = luaV_flttointeger((lua_Number)k,(lua_Integer *)&io,F2Ieq);
      if (iVar2 != 0) {
        f = (lua_Number)io;
        aux.value_.ub = '\x03';
        value_local = (TValue *)&f;
      }
    }
    luaH_newkey(L,t,value_local,value);
  }
  else if (hres < 1) {
    *(lu_byte *)((long)t->array + (ulong)(hres ^ 0xffffffffU) + 4) = value->tt_;
    t->array[-1 - (ulong)(hres ^ 0xffffffffU)] = value->value_;
  }
  else {
    pNVar1 = t->node;
    pNVar1[hres + -3].u.value_ = value->value_;
    pNVar1[hres + -3].u.tt_ = value->tt_;
  }
  return;
}

Assistant:

void luaH_finishset (lua_State *L, Table *t, const TValue *key,
                                    TValue *value, int hres) {
  lua_assert(hres != HOK);
  if (hres == HNOTFOUND) {
    TValue aux;
    if (l_unlikely(ttisnil(key)))
      luaG_runerror(L, "table index is nil");
    else if (ttisfloat(key)) {
      lua_Number f = fltvalue(key);
      lua_Integer k;
      if (luaV_flttointeger(f, &k, F2Ieq)) {
        setivalue(&aux, k);  /* key is equal to an integer */
        key = &aux;  /* insert it as an integer */
      }
      else if (l_unlikely(luai_numisnan(f)))
        luaG_runerror(L, "table index is NaN");
    }
    luaH_newkey(L, t, key, value);
  }
  else if (hres > 0) {  /* regular Node? */
    setobj2t(L, gval(gnode(t, hres - HFIRSTNODE)), value);
  }
  else {  /* array entry */
    hres = ~hres;  /* real index */
    obj2arr(t, cast_uint(hres), value);
  }
}